

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O0

void __thiscall
ConfidentialValue_ConvertFromConfidentialValue_Test::TestBody
          (ConfidentialValue_ConvertFromConfidentialValue_Test *this)

{
  bool bVar1;
  char *message;
  Amount AVar2;
  AssertHelper local_130;
  Message local_128 [2];
  CfdException *anon_var_0;
  int64_t local_110;
  undefined1 local_108;
  allocator local_f9;
  string local_f8;
  ByteData local_d8;
  byte local_b9;
  char *pcStack_b8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_a8;
  int local_9c;
  int64_t local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  undefined1 local_70 [8];
  Amount amount;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData value;
  ConfidentialValue_ConvertFromConfidentialValue_Test *this_local;
  
  value.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"010000000005f5e100",&local_49);
  cfd::core::ByteData::ByteData((ByteData *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  AVar2 = cfd::core::ConfidentialValue::ConvertFromConfidentialValue((ByteData *)local_28);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)AVar2.amount_;
  amount.amount_._0_1_ = AVar2.ignore_check_;
  local_70 = (undefined1  [8])gtest_ar.message_.ptr_;
  local_98 = cfd::core::Amount::GetSatoshiValue((Amount *)local_70);
  local_9c = 100000000;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_90,"amount.GetSatoshiValue()","100000000",&local_98,&local_9c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x99,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff48,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff48);
  if (bVar1) {
    local_b9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f8,"001122",&local_f9);
      cfd::core::ByteData::ByteData(&local_d8,&local_f8);
      AVar2 = cfd::core::ConfidentialValue::ConvertFromConfidentialValue(&local_d8);
      local_110 = AVar2.amount_;
      local_108 = AVar2.ignore_check_;
      cfd::core::ByteData::~ByteData(&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
    if ((local_b9 & 1) != 0) goto LAB_004bcce1;
    pcStack_b8 = 
    "Expected: ConfidentialValue::ConvertFromConfidentialValue(ByteData(\"001122\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_128);
  testing::internal::AssertHelper::AssertHelper
            (&local_130,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
             ,0x9d,pcStack_b8);
  testing::internal::AssertHelper::operator=(&local_130,local_128);
  testing::internal::AssertHelper::~AssertHelper(&local_130);
  testing::Message::~Message(local_128);
LAB_004bcce1:
  cfd::core::ByteData::~ByteData((ByteData *)local_28);
  return;
}

Assistant:

TEST(ConfidentialValue, ConvertFromConfidentialValue) {
  ByteData value("010000000005f5e100");
  Amount amount = ConfidentialValue::ConvertFromConfidentialValue(value);
  EXPECT_EQ(amount.GetSatoshiValue(), 100000000);

  EXPECT_THROW(
      ConfidentialValue::ConvertFromConfidentialValue(ByteData("001122")),
      CfdException);
}